

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMFInterpolater.cpp
# Opt level: O1

void __thiscall
amrex::EBMFCellConsLinInterp::interp
          (EBMFCellConsLinInterp *this,MultiFab *crsemf,int ccomp,MultiFab *finemf,int fcomp,int nc,
          IntVect *ng,Geometry *cgeom,Geometry *fgeom,Box *dest_domain,IntVect *ratio,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,int bcomp)

{
  uint uVar1;
  EBCellFlagFab *this_00;
  bool bVar2;
  FabType FVar3;
  FabType FVar4;
  int iVar5;
  uint uVar6;
  EBFArrayBoxFactory *this_01;
  long lVar7;
  int *piVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int *piVar12;
  uint uVar13;
  uint uVar14;
  Box lhs;
  MFIter mfi;
  Box local_2b4;
  ulong local_298;
  ulong local_290;
  uint local_288;
  uint local_284;
  uint local_280;
  uint local_27c;
  uint local_278;
  uint local_274;
  uint local_270;
  int local_26c;
  int local_268;
  int local_264;
  FabArray<amrex::FArrayBox> *local_260;
  FabArray<amrex::EBCellFlagFab> *local_258;
  FabArray<amrex::FArrayBox> *local_250;
  FabArray<amrex::EBCellFlagFab> *local_248;
  MFCellConsLinInterp *local_240;
  long local_238;
  long local_230;
  ulong local_228;
  long local_220;
  long local_218;
  ulong local_210;
  ulong local_208;
  double *local_200;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  long local_1d0;
  double *local_1c8;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  ulong local_190;
  ulong local_188;
  long local_180;
  long local_178;
  undefined1 local_170 [32];
  int local_150;
  int local_14c;
  int local_148;
  MFIter local_130;
  Array4<const_double> local_d0;
  Array4<double> local_90;
  Box local_4c;
  
  local_290 = CONCAT44(local_290._4_4_,fcomp);
  local_240 = &this->super_MFCellConsLinInterp;
  MFCellConsLinInterp::interp
            (&this->super_MFCellConsLinInterp,crsemf,ccomp,finemf,fcomp,nc,ng,cgeom,fgeom,
             dest_domain,ratio,bcs,bcomp);
  local_260 = &finemf->super_FabArray<amrex::FArrayBox>;
  this_01 = (EBFArrayBoxFactory *)
            __dynamic_cast((finemf->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                           super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                           _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                           &EBFArrayBoxFactory::typeinfo,0);
  local_250 = &crsemf->super_FabArray<amrex::FArrayBox>;
  lVar7 = __dynamic_cast((crsemf->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                         _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                         &EBFArrayBoxFactory::typeinfo,0);
  if ((lVar7 != 0 && this_01 != (EBFArrayBoxFactory *)0x0) &&
     (bVar2 = EBFArrayBoxFactory::isAllRegular(this_01), !bVar2)) {
    local_258 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar7 + 0xd8));
    local_248 = EBDataCollection::getMultiEBCellFlagFab
                          ((this_01->m_ebdc).
                           super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
    MFIter::MFIter(&local_130,&local_260->super_FabArrayBase,'\0');
    if (local_130.currentIndex < local_130.endIndex) {
      local_228 = (ulong)(uint)nc;
      local_230 = (long)ccomp;
      local_238 = (long)(int)local_290;
      do {
        BATransformer::operator()
                  ((Box *)local_170,&((local_130.fabArray)->boxarray).m_bat,
                   (Box *)((long)((local_130.index_map)->super_vector<int,_std::allocator<int>_>).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[local_130.currentIndex] * 0x1c +
                          *(long *)&((((local_130.fabArray)->boxarray).m_ref.
                                      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr)->m_abox).
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data));
        local_2b4.smallend.vect[0] = local_170._0_4_ - ng->vect[0];
        local_2b4.smallend.vect[1] = local_170._4_4_ - ng->vect[1];
        local_2b4.smallend.vect[2] = local_170._8_4_ - ng->vect[2];
        local_2b4.bigend.vect[0] = ng->vect[0] + local_170._12_4_;
        local_2b4.bigend.vect[1] = ng->vect[1] + local_170._16_4_;
        local_2b4.bigend.vect[2] = ng->vect[2] + local_170._20_4_;
        local_2b4.btype.itype = local_170._24_4_;
        uVar1 = (dest_domain->smallend).vect[0];
        if (local_2b4.smallend.vect[0] <= (int)uVar1) {
          local_2b4.smallend.vect[0] = uVar1;
        }
        uVar1 = (dest_domain->smallend).vect[1];
        if (local_2b4.smallend.vect[1] <= (int)uVar1) {
          local_2b4.smallend.vect[1] = uVar1;
        }
        uVar1 = (dest_domain->smallend).vect[2];
        if (local_2b4.smallend.vect[2] <= (int)uVar1) {
          local_2b4.smallend.vect[2] = uVar1;
        }
        uVar1 = (dest_domain->bigend).vect[0];
        if ((int)uVar1 <= local_2b4.bigend.vect[0]) {
          local_2b4.bigend.vect[0] = uVar1;
        }
        uVar1 = (dest_domain->bigend).vect[1];
        if ((int)uVar1 <= local_2b4.bigend.vect[1]) {
          local_2b4.bigend.vect[1] = uVar1;
        }
        uVar1 = (dest_domain->bigend).vect[2];
        if ((int)uVar1 <= local_2b4.bigend.vect[2]) {
          local_2b4.bigend.vect[2] = uVar1;
        }
        MFCellConsLinInterp::CoarseBox(&local_4c,local_240,&local_2b4,ratio);
        piVar8 = &local_130.currentIndex;
        if (local_130.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar8 = ((local_130.local_index_map)->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start + local_130.currentIndex;
        }
        piVar12 = &local_130.currentIndex;
        if (local_130.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar12 = ((local_130.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_130.currentIndex;
        }
        if (*(int *)&((local_250->m_fabs_v).
                      super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[*piVar12]->super_BaseFab<double>).
                     field_0x44 != 0) {
          piVar12 = &local_130.currentIndex;
          if (local_130.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            piVar12 = ((local_130.local_index_map)->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start + local_130.currentIndex;
          }
          this_00 = (local_258->m_fabs_v).
                    super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[*piVar8];
          FVar3 = EBCellFlagFab::getType
                            ((local_248->m_fabs_v).
                             super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[*piVar12],&local_2b4);
          FVar4 = EBCellFlagFab::getType(this_00,&local_4c);
          if ((FVar3 == multivalued) || (FVar4 == multivalued)) {
            Abort_host("EBCellConservativeLinear::interp: multivalued not implemented");
          }
          else if (FVar3 != covered) {
            FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                      ((Array4<const_amrex::EBCellFlag> *)local_170,local_258,&local_130);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_90,local_260,&local_130);
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_d0,local_250,&local_130);
            if (0 < nc) {
              local_210 = (ulong)(uint)local_2b4.bigend.vect[0];
              local_270 = local_2b4.bigend.vect[0] + 1;
              local_298 = 0;
              do {
                if (local_2b4.smallend.vect[2] <= local_2b4.bigend.vect[2]) {
                  local_218 = local_230 + local_298;
                  local_220 = local_238 + local_298;
                  uVar1 = local_2b4.smallend.vect[2];
                  do {
                    if (local_2b4.smallend.vect[1] <= local_2b4.bigend.vect[1]) {
                      uVar9 = uVar1 + 1;
                      local_288 = -uVar9;
                      if (0 < (int)uVar9) {
                        local_288 = uVar9;
                      }
                      local_264 = ratio->vect[0];
                      local_268 = ratio->vect[1];
                      local_26c = ratio->vect[2];
                      local_1a8 = (long)local_150;
                      local_1b0 = (long)local_14c;
                      local_1b8 = (long)local_148;
                      local_278 = ~(local_288 >> 2);
                      if (-1 < (int)uVar1) {
                        local_278 = uVar1 >> 2;
                      }
                      uVar9 = local_2b4.smallend.vect[1];
                      local_280 = ~(local_288 >> 1);
                      if (-1 < (int)uVar1) {
                        local_280 = uVar1 >> 1;
                      }
                      do {
                        if (local_2b4.smallend.vect[0] <= local_2b4.bigend.vect[0]) {
                          uVar10 = uVar9 + 1;
                          local_284 = -uVar10;
                          if (0 < (int)uVar10) {
                            local_284 = uVar10;
                          }
                          local_274 = ~(local_284 >> 2);
                          if (-1 < (int)uVar9) {
                            local_274 = uVar9 >> 2;
                          }
                          local_27c = ~(local_284 >> 1);
                          if (-1 < (int)uVar9) {
                            local_27c = uVar9 >> 1;
                          }
                          local_1c8 = local_d0.p;
                          local_1d0 = local_d0.jstride;
                          local_1d8 = (long)local_d0.begin.x;
                          local_1e0 = (long)local_d0.begin.y;
                          local_1e8 = (long)local_d0.begin.z;
                          local_1f0 = local_d0.kstride;
                          local_1f8 = local_d0.nstride * local_218;
                          local_200 = local_90.p +
                                      ((long)(int)uVar9 - (long)local_90.begin.y) * local_90.jstride
                                      + ((long)(int)uVar1 - (long)local_90.begin.z) *
                                        local_90.kstride + local_90.nstride * local_220;
                          local_208 = (ulong)(uint)-local_90.begin.x;
                          uVar10 = local_2b4.smallend.vect[0];
                          do {
                            local_290 = (ulong)uVar10;
                            if (local_264 == 4) {
                              if ((int)uVar10 < 0) {
                                uVar14 = uVar10 + 1;
                                uVar13 = -uVar14;
                                if (0 < (int)uVar14) {
                                  uVar13 = uVar14;
                                }
                                uVar13 = uVar13 >> 2;
LAB_00523807:
                                uVar13 = ~uVar13;
                              }
                              else {
                                uVar13 = uVar10 >> 2;
                              }
                            }
                            else if (local_264 == 2) {
                              if ((int)uVar10 < 0) {
                                uVar14 = uVar10 + 1;
                                uVar13 = -uVar14;
                                if (0 < (int)uVar14) {
                                  uVar13 = uVar14;
                                }
                                uVar13 = uVar13 >> 1;
                                goto LAB_00523807;
                              }
                              uVar13 = uVar10 >> 1;
                            }
                            else {
                              uVar13 = uVar10;
                              if (local_264 != 1) {
                                if ((int)uVar10 < 0) {
                                  iVar11 = uVar10 + 1;
                                  iVar5 = -iVar11;
                                  if (0 < iVar11) {
                                    iVar5 = iVar11;
                                  }
                                  uVar13 = iVar5 / local_264;
                                  goto LAB_00523807;
                                }
                                uVar13 = (int)uVar10 / local_264;
                              }
                            }
                            uVar14 = uVar9;
                            if (((local_268 != 1) && (uVar14 = local_274, local_268 != 4)) &&
                               (uVar14 = local_27c, local_268 != 2)) {
                              if ((int)uVar9 < 0) {
                                uVar14 = ~((int)local_284 / local_268);
                              }
                              else {
                                uVar14 = (int)uVar9 / local_268;
                              }
                            }
                            uVar6 = uVar1;
                            if (((local_26c != 1) && (uVar6 = local_278, local_26c != 4)) &&
                               (uVar6 = local_280, local_26c != 2)) {
                              if ((int)uVar1 < 0) {
                                uVar6 = ~((int)local_288 / local_26c);
                              }
                              else {
                                uVar6 = (int)uVar1 / local_26c;
                              }
                            }
                            local_178 = (long)(int)uVar13;
                            local_180 = (long)(int)uVar14;
                            uVar13 = *(uint *)(CONCAT44(local_170._4_4_,local_170._0_4_) +
                                               (local_180 - local_1b0) *
                                               CONCAT44(local_170._12_4_,local_170._8_4_) * 4 +
                                               (local_178 - local_1a8) * 4 +
                                              ((int)uVar6 - local_1b8) *
                                              CONCAT44(local_170._20_4_,local_170._16_4_) * 4);
                            if ((int)(((uVar13 >> 0xf & 1) - ((int)uVar13 >> 0x1f)) +
                                      (uint)((uVar13 >> 0x10 & 1) != 0) + (uVar13 >> 0x11 & 1) +
                                      (uint)((uVar13 >> 0x13 & 1) != 0) + (uVar13 >> 0x14 & 1) +
                                      (uint)((uVar13 >> 0x15 & 1) != 0) + (uVar13 >> 0x16 & 1) +
                                      (uint)((uVar13 >> 5 & 1) != 0) + (uVar13 >> 6 & 1) +
                                      (uint)((uVar13 >> 7 & 1) != 0) + (uVar13 >> 8 & 1) +
                                      (uint)((uVar13 >> 9 & 1) != 0) + (uVar13 >> 10 & 1) +
                                      (uint)((uVar13 >> 0xb & 1) != 0) + (uVar13 >> 0xc & 1) +
                                      (uint)((uVar13 >> 0xd & 1) != 0) + (uVar13 >> 0x17 & 1) +
                                      (uint)((uVar13 >> 0x18 & 1) != 0) + (uVar13 >> 0x19 & 1) +
                                      (uint)((uVar13 >> 0x1a & 1) != 0) + (uVar13 >> 0x1b & 1) +
                                      (uint)((uVar13 >> 0x1c & 1) != 0) + (uVar13 >> 0x1d & 1) +
                                      (uint)((uVar13 >> 0x1e & 1) != 0) + 1 +
                                     (uint)((uVar13 >> 0xe & 1) != 0)) < 0x1b) {
                              local_200[(int)(-local_90.begin.x + uVar10)] =
                                   local_d0.p
                                   [(local_180 - local_1e0) * local_d0.jstride +
                                    (local_178 - local_1d8) +
                                    ((int)uVar6 - local_1e8) * local_d0.kstride + local_1f8];
                            }
                            uVar10 = uVar10 + 1;
                            local_188 = (ulong)uVar9;
                          } while (local_270 != uVar10);
                        }
                        bVar2 = uVar9 != local_2b4.bigend.vect[1];
                        uVar9 = uVar9 + 1;
                        local_190 = (ulong)uVar1;
                      } while (bVar2);
                    }
                    bVar2 = uVar1 != local_2b4.bigend.vect[2];
                    uVar1 = uVar1 + 1;
                  } while (bVar2);
                }
                local_298 = local_298 + 1;
              } while (local_298 != local_228);
            }
          }
        }
        MFIter::operator++(&local_130);
      } while (local_130.currentIndex < local_130.endIndex);
    }
    MFIter::~MFIter(&local_130);
  }
  return;
}

Assistant:

void
EBMFCellConsLinInterp::interp (MultiFab const& crsemf, int ccomp, MultiFab& finemf, int fcomp, int nc,
                               IntVect const& ng, Geometry const& cgeom, Geometry const& fgeom,
                               Box const& dest_domain, IntVect const& ratio,
                               Vector<BCRec> const& bcs, int bcomp)
{
    MFCellConsLinInterp::interp(crsemf, ccomp, finemf, fcomp, nc, ng, cgeom, fgeom, dest_domain,
                                ratio, bcs, bcomp);

    auto const ffact = dynamic_cast<EBFArrayBoxFactory const*>(&finemf.Factory());
    auto const cfact = dynamic_cast<EBFArrayBoxFactory const*>(&crsemf.Factory());
    if (!ffact || !cfact || ffact->isAllRegular()) {
        return;
    }

    auto const& cflags = cfact->getMultiEBCellFlagFab();

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& crse = crsemf.const_arrays();
        auto const& fine = finemf.arrays();
        auto const& cflg = cflags.const_arrays();
        ParallelFor(finemf, ng, nc,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            if (dest_domain.contains(i,j,k)) {
                int ic = amrex::coarsen(i,ratio[0]);
                int jc = amrex::coarsen(j,ratio[1]);
#if (AMREX_SPACEDIM == 2)
                int kc = k;
#else
                int kc = amrex::coarsen(k,ratio[2]);
#endif
                if (cflg[box_no](ic,jc,kc).numNeighbors() < AMREX_D_TERM(3,*3,*3)) {
                    fine[box_no](i,j,k,n+fcomp) = crse[box_no](ic,jc,kc,n+ccomp);
                }
            }
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
        auto const& fflags = ffact->getMultiEBCellFlagFab();
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(finemf); mfi.isValid(); ++mfi) {
            Box const target_fine_region = amrex::grow(mfi.validbox(),ng) & dest_domain;
            Box const& crse_bx = CoarseBox(target_fine_region, ratio);
            const EBCellFlagFab& crse_flag_fab = cflags[mfi];
            if (crsemf[mfi].getType() != FabType::regular) {
                const EBCellFlagFab& fine_flag_fab = fflags[mfi];
                const FabType ftype = fine_flag_fab.getType(target_fine_region);
                const FabType ctype = crse_flag_fab.getType(crse_bx);
                if (ftype == FabType::multivalued || ctype == FabType::multivalued)
                {
                    amrex::Abort("EBCellConservativeLinear::interp: multivalued not implemented");
                }
                else if (ftype == FabType::covered)
                {
                    ; // don't need to do anything special
                }
                else
                {
                    const auto& crse_flag = cflags.const_array(mfi);
                    const auto& fine = finemf.array(mfi);
                    const auto& crse = crsemf.const_array(mfi);
                    amrex::LoopConcurrentOnCpu(target_fine_region, nc,
                    [&] (int i, int j, int k, int n) noexcept
                    {
                        int ic = amrex::coarsen(i,ratio[0]);
                        int jc = amrex::coarsen(j,ratio[1]);
#if (AMREX_SPACEDIM == 2)
                        int kc = k;
#else
                        int kc = amrex::coarsen(k,ratio[2]);
#endif
                        if (crse_flag(ic,jc,kc).numNeighbors() < AMREX_D_TERM(3,*3,*3)) {
                            fine(i,j,k,n+fcomp) = crse(ic,jc,kc,n+ccomp);
                        }
                    });
                }
            }
        }
    }
}